

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

bool __thiscall toml::internal::Parser::parseInlineTable(Parser *this,Value *value)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  bool bVar4;
  TokenType TVar5;
  Value *pVVar6;
  size_t *psVar7;
  uint uVar8;
  bool bVar9;
  Value t;
  Value v;
  Value local_b8;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t asStack_80 [2];
  Value local_70;
  Value *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->token_).type_ == LBRACE) {
    nextKey(this);
    p_Var2 = (_Base_ptr)(local_a8 + 8);
    local_a8._16_8_ = (_Base_ptr)0x0;
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = 0;
    asStack_80[0] = 0;
    local_b8.type_ = TABLE_TYPE;
    local_a8._24_8_ = p_Var2;
    local_88 = p_Var2;
    local_b8.field_1.null_ = operator_new(0x30);
    p_Var1 = (_Rb_tree_header *)&(local_b8.field_1.string_)->_M_string_length;
    (((_Rb_tree_header *)&(local_b8.field_1.string_)->_M_string_length)->_M_header)._M_color =
         _S_red;
    if ((_Base_ptr)local_a8._16_8_ == (_Base_ptr)0x0) {
      (((_Rep_type *)
       &(local_b8.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)->
      _M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      *(_Rb_tree_header **)((long)&(local_b8.field_1.string_)->field_2 + 8) = p_Var1;
      ((local_b8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)p_Var1;
      psVar7 = &((local_b8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      (((_Rep_type *)
       &(local_b8.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)->
      _M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_a8._16_8_;
      psVar7 = asStack_80;
      *(undefined8 *)((long)&(local_b8.field_1.string_)->field_2 + 8) = local_a8._24_8_;
      ((local_b8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_88;
      *(_Rb_tree_header **)(local_a8._16_8_ + 8) = p_Var1;
      ((local_b8.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = asStack_80[0];
      local_a8._16_8_ = (_Base_ptr)0x0;
      local_a8._24_8_ = p_Var2;
      local_88 = p_Var2;
    }
    local_60 = value;
    *psVar7 = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                 *)local_a8);
    TVar5 = (this->token_).type_;
    bVar9 = TVar5 == RBRACE;
    if (!bVar9) {
      pcVar3 = local_a8 + 0x10;
      local_58 = &(this->token_).str_value_;
      bVar4 = true;
      do {
        if (!bVar4) {
          if (TVar5 == COMMA) {
            nextKey(this);
            goto LAB_0015c688;
          }
          local_a8._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a8,"inline table didn\'t have \',\' for delimiter?","");
          addError(this,(string *)local_a8);
joined_r0x0015c782:
          if ((pointer)local_a8._0_8_ != pcVar3) {
            operator_delete((void *)local_a8._0_8_,
                            (ulong)((long)&((_Base_ptr)local_a8._16_8_)->_M_color + 1));
          }
          goto LAB_0015c791;
        }
LAB_0015c688:
        local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
        local_a8._8_8_ = 0;
        uVar8 = (this->token_).type_ - IDENT;
        local_a8._0_8_ = pcVar3;
        if (1 < uVar8) goto joined_r0x0015c782;
        std::__cxx11::string::_M_assign((string *)local_a8);
        nextValue(this);
        if ((1 < uVar8) || ((this->token_).type_ != EQUAL)) goto joined_r0x0015c782;
        nextValue(this);
        local_70.type_ = NULL_TYPE;
        local_70.field_1.null_ = (void *)0x0;
        bVar4 = parseValue(this,&local_70);
        if (!bVar4) {
LAB_0015c7ee:
          Value::~Value(&local_70);
          goto joined_r0x0015c782;
        }
        pVVar6 = Value::find(&local_b8,(string *)local_a8);
        if (pVVar6 != (Value *)0x0) {
          std::operator+(&local_50,"inline table has multiple same keys: key=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
          addError(this,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0015c7ee;
        }
        pVVar6 = Value::ensureValue(&local_b8,(string *)local_a8);
        Value::operator=(pVVar6,&local_70);
        Value::~Value(&local_70);
        if ((pointer)local_a8._0_8_ != pcVar3) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
        TVar5 = (this->token_).type_;
        bVar4 = false;
        bVar9 = TVar5 == RBRACE;
      } while (!bVar9);
    }
    nextValue(this);
    pVVar6 = local_60;
    if (&local_b8 != local_60) {
      Value::~Value(local_60);
      pVVar6->type_ = local_b8.type_;
      switch(local_b8.type_) {
      case NULL_TYPE:
      case INT_TYPE:
      case STRING_TYPE:
      case TIME_TYPE:
      case ARRAY_TYPE:
      case TABLE_TYPE:
        (pVVar6->field_1).table_ = (Table *)local_b8.field_1;
        break;
      case BOOL_TYPE:
        (pVVar6->field_1).bool_ = local_b8.field_1.bool_;
        break;
      case DOUBLE_TYPE:
        (pVVar6->field_1).table_ = (Table *)local_b8.field_1;
        break;
      default:
        pVVar6->type_ = NULL_TYPE;
        (pVVar6->field_1).null_ = (void *)0x0;
      }
      local_b8.type_ = NULL_TYPE;
      local_b8.field_1.null_ = (Table *)0x0;
    }
LAB_0015c791:
    Value::~Value(&local_b8);
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

inline bool Parser::consumeForKey(TokenType type)
{
    if (token().type() == type) {
        nextKey();
        return true;
    }

    return false;
}